

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void merge_lcp_2way<false>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  uchar **ppuVar1;
  int iVar2;
  ostream *poVar3;
  uchar **__dest;
  ulong uVar4;
  long lVar5;
  uchar **local_60;
  lcp_t *local_58;
  lcp_t local_50;
  lcp_t *local_48;
  lcp_t local_40;
  int local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"merge_lcp_2way");
  poVar3 = std::operator<<(poVar3,"(): n0=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", n1=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,'\n');
  compare((uchar *)&local_40,*from0,(size_t)*from1);
  __dest = result + 1;
  if (local_38 < 1) {
    *result = *from0;
    local_60 = (uchar **)(n0 - 1);
    ppuVar1 = from1;
    if (local_60 != (uchar **)0x0) {
      from0 = from0 + 1;
      local_50 = *lcp_input0;
      local_48 = lcp_input0 + 1;
      uVar4 = local_40;
      local_58 = lcp_input1;
      goto LAB_0020cb04;
    }
LAB_0020cd0e:
    local_60 = ppuVar1;
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,'~');
    poVar3 = std::operator<<(poVar3,"merge_lcp_2way");
    poVar3 = std::operator<<(poVar3,"(): n0=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", n1=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
    from0 = local_60;
    if (n1 == 0) {
      __assert_fail("n1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0xc6,
                    "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                   );
    }
  }
  else {
    *result = *from1;
    n1 = n1 - 1;
    local_60 = (uchar **)n0;
    if (n1 != 0) {
      from1 = from1 + 1;
      local_50 = local_40;
      local_58 = lcp_input1 + 1;
      uVar4 = *lcp_input1;
      local_48 = lcp_input0;
LAB_0020cb04:
      do {
        lVar5 = 0;
        while (local_50 <= uVar4) {
          if (uVar4 <= local_50) {
            compare((uchar *)&local_40,*from0,*(size_t *)((long)from1 + lVar5));
            local_50 = local_40;
            if (local_38 < 1) {
              *(uchar **)((long)__dest + lVar5) = *from0;
              uVar4 = local_40;
              goto joined_r0x0020cc4a;
            }
            *(undefined8 *)((long)__dest + lVar5) = *(undefined8 *)((long)from1 + lVar5);
            if (n1 == 1) {
              __dest = (uchar **)((long)__dest + lVar5 + 8);
              goto LAB_0020cc77;
            }
            __dest = (uchar **)((long)__dest + lVar5 + 8);
            n1 = n1 - 1;
            from1 = (uchar **)((long)from1 + lVar5 + 8);
            local_58 = (lcp_t *)((long)local_58 + lVar5 + 8);
            uVar4 = local_58[-1];
            goto LAB_0020cb04;
          }
          iVar2 = cmp(*from0,*(void **)((long)from1 + lVar5));
          if (iVar2 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0xad,
                          "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                         );
          }
          *(undefined8 *)((long)__dest + lVar5) = *(undefined8 *)((long)from1 + lVar5);
          uVar4 = *(ulong *)((long)local_58 + lVar5);
          lVar5 = lVar5 + 8;
          n1 = n1 - 1;
          if (n1 == 0) {
            __dest = (uchar **)((long)__dest + lVar5);
            goto LAB_0020cc77;
          }
        }
        iVar2 = cmp(*from0,*(void **)((long)from1 + lVar5));
        if (-1 < iVar2) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0xa7,
                        "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                       );
        }
        *(uchar **)((long)__dest + lVar5) = *from0;
joined_r0x0020cc4a:
        if (local_60 == (uchar **)0x1) {
          __dest = (uchar **)((long)__dest + lVar5 + 8);
          ppuVar1 = (uchar **)((long)from1 + lVar5);
          goto LAB_0020cd0e;
        }
        local_60 = (uchar **)((long)local_60 - 1);
        __dest = (uchar **)((long)__dest + lVar5 + 8);
        local_50 = *local_48;
        from0 = from0 + 1;
        local_48 = local_48 + 1;
        from1 = (uchar **)((long)from1 + lVar5);
        local_58 = (lcp_t *)((long)local_58 + lVar5);
      } while( true );
    }
LAB_0020cc77:
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,'~');
    poVar3 = std::operator<<(poVar3,"merge_lcp_2way");
    poVar3 = std::operator<<(poVar3,"(): n0=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", n1=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
    n1 = (size_t)local_60;
    if (local_60 == (uchar **)0x0) {
      __assert_fail("n0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0xce,
                    "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                   );
    }
  }
  memmove(__dest,from0,n1 << 3);
  return;
}

Assistant:

static void
merge_lcp_2way(unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	lcp_t lcp0=0, lcp1=0;
	{
		int cmp01; lcp_t lcp01;
		std::tie(cmp01, lcp01) = compare(*from0, *from1);
		if (cmp01 <= 0) {
			*result++ = *from0++;
			lcp0 = *lcp_input0++;
			lcp1 = lcp01;
			if (--n0 == 0) goto finish0;
		} else {
			*result++ = *from1++;
			lcp1 = *lcp_input1++;
			lcp0 = lcp01;
			if (--n1 == 0) goto finish1;
		}
	}
	while (true) {
		/*
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '"<<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		*/
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (OutputLCP) *lcp_result++ = lcp0;
			if (cmp01 <= 0) {
				*result++ = *from0++;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else {
				*result++ = *from1++;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	assert(n1);
	std::copy(from1, from1+n1, result);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	assert(n0);
	std::copy(from0, from0+n0, result);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	return;
}